

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_PrintExotic_Test::TestBody
          (TextFormatTest_PrintExotic_Test *this)

{
  char *message_00;
  size_type in_R9;
  FixedMapping replacements;
  string_view s;
  AssertionResult gtest_ar;
  TestAllTypes message;
  internal local_460 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  string local_450;
  string local_430;
  string local_410;
  undefined1 local_3f0 [32];
  undefined8 local_3d0;
  char *local_3c8;
  undefined8 local_3c0;
  char *local_3b8;
  AssertHelper local_3b0;
  pointer local_3a8;
  AlphaNum local_380;
  undefined1 local_350 [80];
  RepeatedField<unsigned_long> local_300 [8];
  RepeatedField<double> local_280 [2];
  RepeatedPtrFieldBase local_260 [24];
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_350,(Arena *)0x0);
  RepeatedField<long>::Add((RepeatedField<long> *)(local_350 + 0x30),-0x8000000000000000);
  RepeatedField<unsigned_long>::Add(local_300,0xffffffffffffffff);
  RepeatedField<double>::Add(local_280,123.456);
  RepeatedField<double>::Add(local_280,1.23e+21);
  RepeatedField<double>::Add(local_280,1.23e-18);
  RepeatedField<double>::Add(local_280,INFINITY);
  RepeatedField<double>::Add(local_280,-INFINITY);
  RepeatedField<double>::Add(local_280,NAN);
  RepeatedField<double>::Add(local_280,-NAN);
  RepeatedField<double>::Add(local_280,NAN);
  RepeatedField<double>::Add(local_280,-NAN);
  local_3f0._16_8_ = 0x90d0a0c08070100;
  local_3f0._8_8_ = 0xc;
  local_3f0._24_5_ = 0x22275c0b;
  local_3f0._0_8_ = local_3f0 + 0x10;
  protobuf::internal::RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (local_260,
             (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)local_3f0);
  if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  local_3a8 = (this->super_TextFormatTest).super_TextFormatTestBase.multi_line_debug_format_prefix_.
              _M_dataplus._M_p;
  local_3b0.data_ =
       (AssertHelperData *)
       (this->super_TextFormatTest).super_TextFormatTestBase.multi_line_debug_format_prefix_.
       _M_string_length;
  local_380.piece_._M_len = 0x14f;
  local_380.piece_._M_str =
       "repeated_int64: -9223372036854775808\nrepeated_uint64: 18446744073709551615\nrepeated_double: 123.456\nrepeated_double: 1.23e+21\nrepeated_double: 1.23e-18\nrepeated_double: inf\nrepeated_double: -inf\nrepeated_double: nan\nrepeated_double: nan\nrepeated_double: nan\nrepeated_double: nan\nrepeated_string: \"\\000\\001\\007\\010\\014\\n\\r\\t\\013\\\\\\\'\\\"\"\n"
  ;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_410,(lts_20250127 *)&local_3b0,&local_380,(AlphaNum *)local_3b0.data_);
  Message::DebugString_abi_cxx11_(&local_450,(Message *)local_350);
  local_3f0._0_8_ = (long *)0x3;
  local_3f0._8_8_ = "e+0";
  local_3f0._16_8_ = 2;
  local_3f0._24_8_ = "e+";
  local_3d0 = 3;
  local_3c8 = "e-0";
  local_3c0 = 2;
  local_3b8 = "e-";
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x2;
  s._M_str = local_3f0;
  s._M_len = (size_t)local_450._M_dataplus._M_p;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (&local_430,(lts_20250127 *)local_450._M_string_length,s,replacements);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_460,
             "absl::StrCat(multi_line_debug_format_prefix_, \"repeated_int64: -9223372036854775808\\n\" \"repeated_uint64: 18446744073709551615\\n\" \"repeated_double: 123.456\\n\" \"repeated_double: 1.23e+21\\n\" \"repeated_double: 1.23e-18\\n\" \"repeated_double: inf\\n\" \"repeated_double: -inf\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_string: \" \"\\\"\\\\000\\\\001\\\\007\\\\010\\\\014\\\\n\\\\r\\\\t\\\\013\\\\\\\\\\\\\'\\\\\\\"\\\"\\n\")"
             ,"RemoveRedundantZeros(message.DebugString())",&local_410,&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  if (local_460[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f0);
    if (local_458 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message_00 = (local_458->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x5fb,message_00);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((long *)local_3f0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_3f0._0_8_ + 8))();
    }
  }
  if (local_458 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_458,local_458);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_350);
  return;
}

Assistant:

TEST_F(TextFormatTest, PrintExotic) {
  unittest::TestAllTypes message;

  message.add_repeated_int64(int64_t{-9223372036854775807} - 1);
  message.add_repeated_uint64(uint64_t{18446744073709551615u});
  message.add_repeated_double(123.456);
  message.add_repeated_double(1.23e21);
  message.add_repeated_double(1.23e-18);
  message.add_repeated_double(std::numeric_limits<double>::infinity());
  message.add_repeated_double(-std::numeric_limits<double>::infinity());
  message.add_repeated_double(std::numeric_limits<double>::quiet_NaN());
  message.add_repeated_double(-std::numeric_limits<double>::quiet_NaN());
  message.add_repeated_double(std::numeric_limits<double>::signaling_NaN());
  message.add_repeated_double(-std::numeric_limits<double>::signaling_NaN());
  message.add_repeated_string(std::string("\000\001\a\b\f\n\r\t\v\\\'\"", 12));

  // Fun story:  We used to use 1.23e22 instead of 1.23e21 above, but this
  //   seemed to trigger an odd case on MinGW/GCC 3.4.5 where GCC's parsing of
  //   the value differed from strtod()'s parsing.  That is to say, the
  //   following assertion fails on MinGW:
  //     assert(1.23e22 == strtod("1.23e22", nullptr));
  //   As a result, SimpleDtoa() would print the value as
  //   "1.2300000000000001e+22" to make sure strtod() produce the exact same
  //   result.  Our goal is to test runtime parsing, not compile-time parsing,
  //   so this wasn't our problem.  It was found that using 1.23e21 did not
  //   have this problem, so we switched to that instead.

  EXPECT_EQ(
      absl::StrCat(multi_line_debug_format_prefix_,
                   "repeated_int64: -9223372036854775808\n"
                   "repeated_uint64: 18446744073709551615\n"
                   "repeated_double: 123.456\n"
                   "repeated_double: 1.23e+21\n"
                   "repeated_double: 1.23e-18\n"
                   "repeated_double: inf\n"
                   "repeated_double: -inf\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_string: "
                   "\"\\000\\001\\007\\010\\014\\n\\r\\t\\013\\\\\\'\\\"\"\n"),
      RemoveRedundantZeros(message.DebugString()));
}